

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O0

void Imf_3_2::loadFlatImage(string *fileName,Header *hdr,FlatImage *img)

{
  char *pcVar1;
  ulong uVar2;
  ostream *poVar3;
  ArgExc *pAVar4;
  string *in_RDI;
  stringstream _iex_throw_s_2;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  bool multiPart;
  bool deep;
  bool tiled;
  stringstream local_4c8 [16];
  ostream local_4b8 [264];
  FlatImage *in_stack_fffffffffffffc50;
  Header *in_stack_fffffffffffffc58;
  string *in_stack_fffffffffffffc60;
  stringstream local_340 [16];
  ostream local_330 [16];
  FlatImage *in_stack_fffffffffffffce0;
  Header *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  stringstream local_1a8 [16];
  ostream local_198 [381];
  bool local_1b;
  bool local_1a;
  bool local_19 [17];
  string *local_8;
  
  local_8 = in_RDI;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  uVar2 = Imf_3_2::isOpenExrFile(pcVar1,local_19,&local_1a,&local_1b);
  if ((uVar2 & 1) == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar3 = std::operator<<(local_198,"Cannot load image file ");
    poVar3 = std::operator<<(poVar3,local_8);
    std::operator<<(poVar3,".  The file is not an OpenEXR file.");
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar4,local_1a8);
    __cxa_throw(pAVar4,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  if ((local_1b & 1U) != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_340);
    poVar3 = std::operator<<(local_330,"Cannot load image file ");
    poVar3 = std::operator<<(poVar3,local_8);
    std::operator<<(poVar3,".  Multi-part file loading is not supported.");
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar4,local_340);
    __cxa_throw(pAVar4,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  if ((local_1a & 1U) != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_4c8);
    poVar3 = std::operator<<(local_4b8,"Cannot load deep image file ");
    poVar3 = std::operator<<(poVar3,local_8);
    std::operator<<(poVar3," as a flat image.");
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar4,local_4c8);
    __cxa_throw(pAVar4,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  if ((local_19[0] & 1U) == 0) {
    loadFlatScanLineImage
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  }
  else {
    loadFlatTiledImage(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50
                      );
  }
  return;
}

Assistant:

void
loadFlatImage (const string& fileName, Header& hdr, FlatImage& img)
{
    bool tiled, deep, multiPart;

    if (!isOpenExrFile (fileName.c_str (), tiled, deep, multiPart))
    {
        THROW (
            ArgExc,
            "Cannot load image file " << fileName
                                      << ".  "
                                         "The file is not an OpenEXR file.");
    }

    if (multiPart)
    {
        THROW (
            ArgExc,
            "Cannot load image file "
                << fileName
                << ".  "
                   "Multi-part file loading is not supported.");
    }

    if (deep)
    {
        THROW (
            ArgExc,
            "Cannot load deep image file " << fileName
                                           << " "
                                              "as a flat image.");
    }

    if (tiled)
        loadFlatTiledImage (fileName, hdr, img);
    else
        loadFlatScanLineImage (fileName, hdr, img);
}